

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O1

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementVector
          (DiscreteKalmanFilterHelper *this,VectorDynSize *y)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = iDynTree::VectorDynSize::size();
  sVar1 = this->m_dim_Y;
  if (sVar2 == sVar1) {
    iDynTree::VectorDynSize::operator=(&this->m_y,y);
    this->m_measurement_updated = true;
  }
  else {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfSetInitialState",
               "Could not set measurement - dimension mismatch");
  }
  return sVar2 == sVar1;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetMeasurementVector(const iDynTree::VectorDynSize& y)
{
    if (y.size() != m_dim_Y)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetInitialState", "Could not set measurement - dimension mismatch");
        return false;
    }

    m_y = y;
    m_measurement_updated = true;
    return true;
}